

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

void jessilib::impl_join::
     join_mb_append<std::basic_string_view<char32_t,std::char_traits<char32_t>>&>
               (string *out_string,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_string)

{
  char32_t *in_RCX;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_00;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *local_18;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_string_local;
  string *out_string_local;
  
  in_string_00._M_str = in_RCX;
  in_string_00._M_len = (size_t)in_string->_M_str;
  local_18 = in_string;
  in_string_local = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)out_string;
  ustring_to_mbstring<char32_t>(&local_40,(jessilib *)in_string->_M_len,in_string_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_string_local,
             &local_40.second);
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_40);
  join_mb_append((string *)in_string_local);
  return;
}

Assistant:

void join_mb_append(std::string& out_string, InT&& in_string, ArgsT&&... in_args) {
	// TODO: is this a valid approach? is mbstate fine it discard between appends?
	if constexpr (std::is_same_v<char32_t, InT>) {
		out_string += ustring_to_mbstring(std::u32string_view{ &in_string, 1 }).second;
	}
	else {
		out_string += ustring_to_mbstring(in_string).second;
	}

	join_mb_append(out_string, std::forward<ArgsT>(in_args)...);
}